

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_helpers.hpp
# Opt level: O0

void print_py_error(void)

{
  _object *p;
  result_type pbVar1;
  logger *this;
  proxy<boost::python::api::attribute_policies> local_e0;
  object local_d0;
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8
  ;
  undefined1 local_88 [8];
  string err_text;
  object local_58;
  object err;
  object local_48;
  object sys;
  undefined1 local_30 [8];
  logger safe_cout;
  
  logger::logger((logger *)local_30);
  PyErr_Print();
  p = (_object *)PyImport_ImportModule("sys");
  boost::python::handle<_object>::handle<_object>((handle<_object> *)&err,p);
  boost::python::api::object::object(&local_48,(handle *)&err);
  boost::python::handle<_object>::~handle((handle<_object> *)&err);
  boost::python::api::object_operators<boost::python::api::object>::attr
            ((object_operators<boost::python::api::object> *)(err_text.field_2._M_local_buf + 8),
             (char *)&local_48);
  boost::python::api::proxy::operator_cast_to_object((proxy *)&local_58);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)((long)&err_text.field_2 + 8));
  boost::python::api::object_operators<boost::python::api::object>::attr
            ((object_operators<boost::python::api::object> *)&local_e0,(char *)&local_58);
  boost::python::api::
  object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_>::operator()
            ((object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_> *
             )&local_d0);
  boost::python::
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::extract
            (&local_c8,&local_d0);
  pbVar1 = boost::python::extract::operator_cast_to_string_((extract *)&local_c8);
  std::__cxx11::string::string((string *)local_88,(string *)pbVar1);
  boost::python::
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~extract(&local_c8);
  boost::python::api::object::~object(&local_d0);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy(&local_e0);
  this = logger::operator<<((logger *)local_30,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88);
  logger::operator<<(this,(char (*) [2])0x127059);
  std::__cxx11::string::~string((string *)local_88);
  boost::python::api::object::~object(&local_58);
  boost::python::api::object::~object(&local_48);
  PyErr_Clear();
  logger::~logger((logger *)local_30);
  return;
}

Assistant:

void print_py_error() {
    logger safe_cout;
	try {
		PyErr_Print();
		bp::object sys(bp::handle<>(PyImport_ImportModule("sys")));
		bp::object err = sys.attr("stderr");
		std::string err_text = bp::extract<std::string>(err.attr("getvalue")());
		safe_cout << err_text << "\n";
	} catch (...) {
		safe_cout << "Failed to parse python error\n";
	}
	PyErr_Clear();
}